

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O2

bool __thiscall
rlottie::internal::renderer::Stroke::updateContent
          (Stroke *this,int frameNo,VMatrix *matrix,float alpha)

{
  Filter<rlottie::internal::model::Stroke> *this_00;
  Drawable *this_01;
  CapStyle cap;
  JoinStyle join;
  Stroke *pSVar1;
  float *pfVar2;
  anon_union_8_3_adf75f03_for_VBrush_2 aVar3;
  long *plVar4;
  vector<float,_std::allocator<float>_> *pvVar5;
  undefined8 *puVar6;
  float *elm;
  float *pfVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  Color CVar11;
  VColor color;
  VBrush brush;
  VColor local_44;
  VBrush local_40;
  
  this_00 = &this->mModel;
  fVar8 = model::Filter<rlottie::internal::model::Stroke>::opacity(this_00,frameNo);
  CVar11 = model::Filter<rlottie::internal::model::Stroke>::color(this_00,frameNo);
  local_40.field_1.mColor = (VColor)CVar11.b;
  local_40._0_8_ = CVar11._0_8_;
  local_44 = model::Color::toColor((Color *)&local_40,fVar8 * alpha);
  VBrush::VBrush(&local_40,&local_44);
  this_01 = &(this->super_Paint).mDrawable;
  aVar3._4_4_ = local_40.field_1._4_4_;
  aVar3.mColor = local_40.field_1.mColor;
  (this->super_Paint).mDrawable.super_VDrawable.mBrush.mType = local_40.mType;
  *(undefined4 *)&(this->super_Paint).mDrawable.super_VDrawable.mBrush.field_0x4 = local_40._4_4_;
  (this->super_Paint).mDrawable.super_VDrawable.mBrush.field_1 = aVar3;
  fVar9 = VMatrix::scale(matrix);
  pSVar1 = (this->mModel).super_FilterBase<rlottie::internal::model::Stroke>.model_;
  cap = pSVar1->mCapStyle;
  join = pSVar1->mJoinStyle;
  fVar8 = pSVar1->mMiterLimit;
  fVar10 = model::Filter<rlottie::internal::model::Stroke>::strokeWidth(this_00,frameNo);
  VDrawable::setStrokeInfo(&this_01->super_VDrawable,cap,join,fVar8,fVar10 * fVar9);
  pSVar1 = (this->mModel).super_FilterBase<rlottie::internal::model::Stroke>.model_;
  if ((pSVar1->mDash).mData.
      super__Vector_base<rlottie::internal::model::Property<float,_void>,_std::allocator<rlottie::internal::model::Property<float,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      *(pointer *)
       ((long)&(pSVar1->mDash).mData.
               super__Vector_base<rlottie::internal::model::Property<float,_void>,_std::allocator<rlottie::internal::model::Property<float,_void>_>_>
               ._M_impl.super__Vector_impl_data + 8)) {
    plVar4 = (long *)_ZTWL11Dash_Vector();
    if (plVar4[1] != *plVar4) {
      plVar4[1] = *plVar4;
    }
    pvVar5 = (vector<float,_std::allocator<float>_> *)_ZTWL11Dash_Vector();
    model::Filter<rlottie::internal::model::Stroke>::getDashInfo(this_00,frameNo,pvVar5);
    plVar4 = (long *)_ZTWL11Dash_Vector();
    if (*plVar4 != plVar4[1]) {
      puVar6 = (undefined8 *)_ZTWL11Dash_Vector();
      pfVar2 = (float *)puVar6[1];
      for (pfVar7 = (float *)*puVar6; pfVar7 != pfVar2; pfVar7 = pfVar7 + 1) {
        *pfVar7 = *pfVar7 * fVar9;
      }
      pvVar5 = (vector<float,_std::allocator<float>_> *)_ZTWL11Dash_Vector();
      VDrawable::setDashInfo(&this_01->super_VDrawable,pvVar5);
    }
  }
  return local_44.a != '\0';
}

Assistant:

bool renderer::Stroke::updateContent(int frameNo, const VMatrix &matrix,
                                     float alpha)
{
    auto combinedAlpha = alpha * mModel.opacity(frameNo);
    auto color = mModel.color(frameNo).toColor(combinedAlpha);

    VBrush brush(color);
    mDrawable.setBrush(brush);
    float scale = matrix.scale();
    mDrawable.setStrokeInfo(mModel.capStyle(), mModel.joinStyle(),
                            mModel.miterLimit(),
                            mModel.strokeWidth(frameNo) * scale);

    if (mModel.hasDashInfo()) {
        Dash_Vector.clear();
        mModel.getDashInfo(frameNo, Dash_Vector);
        if (!Dash_Vector.empty()) {
            for (auto &elm : Dash_Vector) elm *= scale;
            mDrawable.setDashInfo(Dash_Vector);
        }
    }

    return !color.isTransparent();
}